

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

TestCase * __thiscall doctest::detail::TestCase::operator=(TestCase *this,TestCase *other)

{
  char *pcVar1;
  TestCaseData *in_RSI;
  TestCase *in_RDI;
  String *unaff_retaddr;
  TestCase *other_00;
  
  other_00 = in_RDI;
  TestCaseData::operator=(in_RSI,&in_RDI->super_TestCaseData);
  in_RDI->m_test = (funcType)in_RSI[1].m_file.field_0.data.ptr;
  in_RDI->m_type = *(char **)((long)&in_RSI[1].m_file.field_0 + 8);
  in_RDI->m_template_id = *(int *)((long)&in_RSI[1].m_file.field_0 + 0x10);
  String::operator=(unaff_retaddr,(String *)other_00);
  if (in_RDI->m_template_id != -1) {
    pcVar1 = String::c_str((String *)in_RDI);
    (in_RDI->super_TestCaseData).m_name = pcVar1;
  }
  return in_RDI;
}

Assistant:

TestCase& TestCase::operator=(const TestCase& other) {
        static_cast<TestCaseData&>(*this) = static_cast<const TestCaseData&>(other);

        m_test        = other.m_test;
        m_type        = other.m_type;
        m_template_id = other.m_template_id;
        m_full_name   = other.m_full_name;

        if(m_template_id != -1)
            m_name = m_full_name.c_str();
        return *this;
    }